

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

void duckdb::ParquetWriteCombine
               (ExecutionContext *context,FunctionData *bind_data_p,GlobalFunctionData *gstate,
               LocalFunctionData *lstate)

{
  ColumnDataCollection *this;
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  *this_00;
  ClientContext *context_00;
  pointer pLVar1;
  idx_t iVar2;
  pointer pCVar3;
  pointer pPVar4;
  type buffer;
  ColumnDataCollection *this_01;
  pointer *__ptr;
  type owned_combine_buffer;
  unique_lock<std::mutex> guard;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  unique_lock<std::mutex> local_40;
  
  this = (ColumnDataCollection *)(lstate + 1);
  if (lstate[6]._vptr_LocalFunctionData <
      (_func_int **)((ulong)bind_data_p[0xe]._vptr_FunctionData >> 1)) {
    iVar2 = ColumnDataCollection::SizeInBytes(this);
    if (iVar2 < (ulong)bind_data_p[0xf]._vptr_FunctionData >> 1) {
      local_40._M_device = (mutex_type *)(gstate + 2);
      local_40._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      this_00 = (__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                 *)(gstate + 7);
      if (gstate[7]._vptr_GlobalFunctionData == (_func_int **)0x0) {
        context_00 = context->client;
        this_01 = (ColumnDataCollection *)operator_new(0x70);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_58,
                   (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(lstate + 3)
                  );
        ColumnDataCollection::ColumnDataCollection
                  (this_01,context_00,(vector<duckdb::LogicalType,_true> *)&local_58,
                   BUFFER_MANAGER_ALLOCATOR);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58)
        ;
        ::std::
        __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ::reset(this_00,this_01);
        pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                               *)this_00);
        ColumnDataCollection::Combine(pCVar3,this);
      }
      else {
        pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                               *)this_00);
        ColumnDataCollection::Combine(pCVar3,this);
        pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                               *)this_00);
        if (pCVar3->count < (ulong)bind_data_p[0xe]._vptr_FunctionData >> 1) {
          pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                   ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                                 *)this_00);
          iVar2 = ColumnDataCollection::SizeInBytes(pCVar3);
          if (iVar2 < (ulong)bind_data_p[0xf]._vptr_FunctionData >> 1) goto LAB_01b6eb88;
        }
        local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(this_00->_M_t).
                      super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
                      .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl;
        (this_00->_M_t).
        super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
        .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
             (ColumnDataCollection *)0x0;
        ::std::unique_lock<std::mutex>::unlock(&local_40);
        pPVar4 = unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                 ::operator->((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                               *)(gstate + 1));
        buffer = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator*((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                              *)&local_58);
        ParquetWriter::Flush(pPVar4,buffer);
        pLVar1 = local_58.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ColumnDataCollection *)
            local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start != (ColumnDataCollection *)0x0) {
          ColumnDataCollection::~ColumnDataCollection
                    ((ColumnDataCollection *)
                     local_58.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start);
          operator_delete(pLVar1);
        }
      }
LAB_01b6eb88:
      ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return;
    }
  }
  pPVar4 = unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>::
           operator->((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                       *)(gstate + 1));
  ParquetWriter::Flush(pPVar4,this);
  return;
}

Assistant:

void ParquetWriteCombine(ExecutionContext &context, FunctionData &bind_data_p, GlobalFunctionData &gstate,
                         LocalFunctionData &lstate) {
	auto &bind_data = bind_data_p.Cast<ParquetWriteBindData>();
	auto &global_state = gstate.Cast<ParquetWriteGlobalState>();
	auto &local_state = lstate.Cast<ParquetWriteLocalState>();

	if (local_state.buffer.Count() >= bind_data.row_group_size / 2 ||
	    local_state.buffer.SizeInBytes() >= bind_data.row_group_size_bytes / 2) {
		// local state buffer is more than half of the row_group_size(_bytes), just flush it
		global_state.writer->Flush(local_state.buffer);
		return;
	}

	unique_lock<mutex> guard(global_state.lock);
	if (global_state.combine_buffer) {
		// There is still some data, combine it
		global_state.combine_buffer->Combine(local_state.buffer);
		if (global_state.combine_buffer->Count() >= bind_data.row_group_size / 2 ||
		    global_state.combine_buffer->SizeInBytes() >= bind_data.row_group_size_bytes / 2) {
			// After combining, the combine buffer is more than half of the row_group_size(_bytes), so we flush
			auto owned_combine_buffer = std::move(global_state.combine_buffer);
			guard.unlock();
			// Lock free, of course
			global_state.writer->Flush(*owned_combine_buffer);
		}
		return;
	}

	global_state.combine_buffer = make_uniq<ColumnDataCollection>(context.client, local_state.buffer.Types());
	global_state.combine_buffer->Combine(local_state.buffer);
}